

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O3

void Gia_IsoManStop(Gia_IsoMan_t *p)

{
  Vec_Int_t *pVVar1;
  int *piVar2;
  
  pVVar1 = p->vClasses;
  piVar2 = pVVar1->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar1);
  pVVar1 = p->vClasses2;
  piVar2 = pVVar1->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar1);
  if (p->pLevels != (int *)0x0) {
    free(p->pLevels);
    p->pLevels = (int *)0x0;
  }
  if (p->pUniques != (int *)0x0) {
    free(p->pUniques);
    p->pUniques = (int *)0x0;
  }
  if (p->pStoreW != (word *)0x0) {
    free(p->pStoreW);
  }
  free(p);
  return;
}

Assistant:

void Gia_IsoManStop( Gia_IsoMan_t * p )
{
    // class representation
    Vec_IntFree( p->vClasses );
    Vec_IntFree( p->vClasses2 );
    // internal data
    ABC_FREE( p->pLevels );
    ABC_FREE( p->pUniques );
    ABC_FREE( p->pStoreW );
    ABC_FREE( p );
}